

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O2

bool __thiscall
psy::C::Parser::parseExtGNU_AttributeSpecifierList_AtFirst
          (Parser *this,SpecifierListSyntax **specList)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *pSVar3;
  ostream *poVar4;
  SpecifierSyntax *spec;
  
  pSVar2 = peek(this,1);
  if (pSVar2->syntaxK_ == KeywordAlias___attribute) {
    do {
      spec = (SpecifierSyntax *)0x0;
      bVar1 = parseExtGNU_AttributeSpecifier_AtFirst(this,&spec);
      if (!bVar1) goto LAB_002e84fd;
      pSVar3 = makeNode<psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>,psy::C::SpecifierSyntax*&>
                         (this,&spec);
      *specList = pSVar3;
      specList = &(pSVar3->
                  super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                  ).
                  super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                  .next;
      pSVar2 = peek(this,1);
    } while (pSVar2->syntaxK_ == KeywordAlias___attribute);
    bVar1 = true;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x653);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"assert failure: `__attribute__\'");
    std::endl<char,std::char_traits<char>>(poVar4);
LAB_002e84fd:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parser::parseExtGNU_AttributeSpecifierList_AtFirst(SpecifierListSyntax*& specList)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword_ExtGNU___attribute__,
                  return false,
                  "assert failure: `__attribute__'");

    SpecifierListSyntax** specList_cur = &specList;

    do {
        SpecifierSyntax* spec = nullptr;
        if (!parseExtGNU_AttributeSpecifier_AtFirst(spec))
            return false;

        *specList_cur = makeNode<SpecifierListSyntax>(spec);
        specList_cur = &(*specList_cur)->next;
    }
    while (peek().kind() == SyntaxKind::Keyword_ExtGNU___attribute__);

    return true;
}